

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::ScriptContext(ScriptContext *this,ThreadContext *threadContext)

{
  bool isOptimizedForManyInstances;
  uint uVar1;
  NoSpecialPropertyThreadRegistry *threadRegistry;
  OnlyWritablePropertyThreadRegistry *threadRegistry_00;
  PageAllocator *pPVar2;
  ArenaAllocator *allocator;
  Recycler *pRVar3;
  ThreadConfiguration *threadConfig;
  time_t tVar4;
  HiResTimer *this_00;
  DebugCheckNoException local_2c;
  DebugCheckNoException __debugCheckNoException;
  ThreadContext *threadContext_local;
  ScriptContext *this_local;
  
  ScriptContextBase::ScriptContextBase(&this->super_ScriptContextBase);
  ScriptContextInfo::ScriptContextInfo(&this->super_ScriptContextInfo);
  (this->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)&PTR_GetNullAddr_01de1800;
  this->jitFuncRangeCache = (JITPageAddrToFuncRangeCache *)0x0;
  this->next = (ScriptContext *)0x0;
  this->prev = (ScriptContext *)0x0;
  ScriptContextOptimizationOverrideInfo::ScriptContextOptimizationOverrideInfo
            (&this->optimizationOverrides);
  this->CurrentThunk = InterpreterStackFrame::DelayDynamicInterpreterThunk;
  this->CurrentCrossSiteThunk = CrossSite::DefaultThunk;
  this->DeferredParsingThunk = JavascriptFunction::DeferredParsingThunk;
  this->DeferredDeserializationThunk = JavascriptFunction::DeferredDeserializeThunk;
  this->DispatchDefaultInvoke = (JavascriptMethod)0x0;
  this->DispatchProfileInvoke = (JavascriptMethod)0x0;
  Memory::
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
  ::RecyclerRootPtr(&this->calleeUtf8SourceInfoList);
  threadRegistry = ThreadContext::GetNoSpecialPropertyRegistry(threadContext);
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::NoSpecialPropertyCache>_>::ScriptCacheRegistry
            (&this->noSpecialPropertyRegistry,this,threadRegistry);
  threadRegistry_00 = ThreadContext::GetOnlyWritablePropertyRegistry(threadContext);
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::ScriptCacheRegistry
            (&this->onlyWritablePropertyRegistry,this,threadRegistry_00);
  pPVar2 = ThreadContext::GetPageAllocator(threadContext);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->generalAllocator,L"SC-General",pPVar2,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  pPVar2 = ThreadContext::GetPageAllocator(threadContext);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->dynamicProfileInfoAllocator,L"SC-DynProfileInfo",pPVar2,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  pPVar2 = ThreadContext::GetPageAllocator(threadContext);
  Memory::InlineCacheAllocator::InlineCacheAllocator
            (&this->inlineCacheAllocator,L"SC-InlineCache",pPVar2,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  pPVar2 = ThreadContext::GetPageAllocator(threadContext);
  Memory::CacheAllocator::CacheAllocator
            (&this->isInstInlineCacheAllocator,L"SC-IsInstInlineCache",pPVar2,Throw::OutOfMemory);
  pPVar2 = ThreadContext::GetPageAllocator(threadContext);
  Memory::CacheAllocator::CacheAllocator
            (&this->enumeratorCacheAllocator,L"SC-EnumeratorCache",pPVar2,Throw::OutOfMemory);
  this->interpreterArena = (ArenaAllocator *)0x0;
  this->diagnosticArena = (ArenaAllocator *)0x0;
  this->m_remoteScriptContextAddr = (PSCRIPTCONTEXT_HANDLE)0x0;
  this->startupComplete = false;
  this->isInvalidatedForHostObjects = false;
  this->isEnumeratingRecyclerObjects = false;
  this->m_enumerateNonUserFunctionsOnly = false;
  this->threadContext = threadContext;
  this->directHostTypeId = TypeIds_GlobalObject;
  this->intConstPropsOnGlobalObject = (PropIdSetForConstProp *)0x0;
  this->intConstPropsOnGlobalUserObject = (PropIdSetForConstProp *)0x0;
  this->firstInterpreterFrameReturnAddress = (void *)0x0;
  pPVar2 = ThreadContext::GetPageAllocator(threadContext);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->sourceCodeAllocator,L"SC-Code",pPVar2,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  pPVar2 = ThreadContext::GetPageAllocator(threadContext);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->regexAllocator,L"SC-Regex",pPVar2,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  pPVar2 = ThreadContext::GetPageAllocator(threadContext);
  Memory::ArenaAllocator::ArenaAllocator
            (&this->miscAllocator,L"GC-Misc",pPVar2,Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  allocator = MiscAllocator(this);
  JsUtil::
  BaseHashSet<void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_void_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->bindRef,allocator,0);
  this->stringProfiler = (StringProfiler *)0x0;
  this->bailOutRecordBytes = 0;
  this->bailOutOffsetBytes = 0;
  this->codeSize = 0;
  this->oomExceptionCount = 0;
  this->soExceptionCount = 0;
  this->rejitStatsMap = (RejitStatsMap *)0x0;
  this->bailoutReasonCounts = (BailoutStatsMap *)0x0;
  this->bailoutReasonCountsCap = (BailoutStatsMap *)0x0;
  this->rejitReasonCounts = (uint *)0x0;
  this->rejitReasonCountsCap = (uint *)0x0;
  this->cacheDataMap = (CacheDataMap *)0x0;
  this->fieldAccessStatsByFunctionNumber = (FieldAccessStatsByFunctionNumberMap *)0x0;
  this->regexDebugWriter = (DebugWriter *)0x0;
  this->regexStatsDatabase = (RegexStatsDatabase *)0x0;
  this->trigramAlphabet = (TrigramAlphabet *)0x0;
  this->regexStacks = (RegexStacks *)0x0;
  pRVar3 = ThreadContext::EnsureRecycler(threadContext);
  this->recycler = pRVar3;
  Memory::RecyclerFastAllocator<Js::JavascriptNumber,_(Memory::ObjectInfoBits)32>::
  RecyclerFastAllocator(&this->numberAllocator);
  threadConfig = ThreadContext::GetConfig(threadContext);
  isOptimizedForManyInstances = ThreadContext::IsOptimizedForManyInstances(threadContext);
  ScriptConfiguration::ScriptConfiguration(&this->config,threadConfig,isOptimizedForManyInstances);
  this->interpreterThunkEmitter = (InterpreterThunkEmitter *)0x0;
  this->backgroundParser = (BackgroundParser *)0x0;
  this->asmJsInterpreterThunkEmitter = (InterpreterThunkEmitter *)0x0;
  this->asmJsCodeGenerator = (AsmJsCodeGenerator *)0x0;
  this->nativeCodeGen = (NativeCodeGenerator *)0x0;
  this->hostScriptContext = (HostScriptContext *)0x0;
  this->scriptEngineHaltCallback = (HaltCallback *)0x0;
  this->scriptStartEventHandler = (EventHandler)0x0;
  this->scriptEndEventHandler = (EventHandler)0x0;
  this->integerStringMapCacheMissCount = 0;
  this->integerStringMapCacheUseCount = 0;
  this->referencesSharedDynamicSourceContextInfo = false;
  this->isScriptContextActuallyClosed = false;
  this->isFinalized = false;
  this->isEvalRestricted = false;
  this->isInitialized = false;
  this->isCloningGlobal = false;
  this->fastDOMenabled = false;
  this->hasUsedInlineCache = false;
  this->hasProtoOrStoreFieldInlineCache = false;
  this->hasIsInstInlineCache = false;
  this->deferredBody = false;
  this->isPerformingNonreentrantWork = false;
  this->isDiagnosticsScriptContext = false;
  this->scriptContextPrivilegeLevel = Low;
  this->sourceSize = 0;
  Memory::
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
  ::RecyclerRootPtr(&this->sourceList);
  this->raiseMessageToDebuggerFunctionType = (RaiseMessageToDebuggerFunctionType)0x0;
  this->transitionToDebugModeIfFirstSourceFn = (TransitionToDebugModeIfFirstSourceFn)0x0;
  this->debugContext = (DebugContext *)0x0;
  CriticalSection::CriticalSection(&this->debugContextCloseCS,0);
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::SListBase
            (&this->weakReferenceDictionaryList);
  this->isWeakReferenceDictionaryListCleared = false;
  this->isDebugContextInitialized = false;
  this->moduleSrcInfoCount = 0;
  this->url = L"";
  this->webWorkerId = 0;
  HostScriptContextCallbackFunctor::HostScriptContextCallbackFunctor(&this->TTDHostCallbackFunctor);
  this->ScriptContextLogTag = 0;
  this->TTDWellKnownInfo = (RuntimeContextInfo *)0x0;
  this->TTDContextInfo = (ScriptContextTTD *)0x0;
  this->TTDSnapshotOrInflateInProgress = false;
  this->TTDRecordOrReplayModeEnabled = false;
  this->TTDRecordModeEnabled = false;
  this->TTDReplayModeEnabled = false;
  this->TTDShouldPerformRecordOrReplayAction = false;
  this->TTDShouldPerformRecordAction = false;
  this->TTDShouldPerformReplayAction = false;
  this->TTDShouldPerformRecordOrReplayDebuggerAction = false;
  this->TTDShouldPerformRecordDebuggerAction = false;
  this->TTDShouldPerformReplayDebuggerAction = false;
  this->TTDShouldSuppressGetterInvocationForDebuggerEvaluation = false;
  this->emptyStringPropertyId = 0x10;
  this->m_pBuiltinFunctionIdMap = (BuiltinFunctionIdDictionary *)0x0;
  this->builtInLibraryFunctions = (BuiltInLibraryFunctionMap *)0x0;
  this->nextPendingClose = (ScriptContext *)0x0;
  ThreadContext::EnsureDebugManager(threadContext);
  DebugCheckNoException::DebugCheckNoException(&local_2c);
  tVar4 = time((time_t *)0x0);
  this->createTime = tVar4;
  this->speculativeJitCount = 0;
  this->loopJITCount = 0;
  this->funcJitCodeUsed = 0;
  this->jitCodeUsed = 0;
  this->interpretedCallsHighPri = 0;
  this->bytecodeJITCount = 0;
  this->funcJITCount = 0;
  this->maxFuncInterpret = 0;
  this->interpretedCount = 0;
  this->convertNullToSimpleCount = 0;
  this->convertNullToSimpleDictionaryCount = 0;
  this->convertNullToDictionaryCount = 0;
  this->convertDeferredToDictionaryCount = 0;
  this->convertDeferredToSimpleDictionaryCount = 0;
  this->convertSimpleToDictionaryCount = 0;
  this->convertSimpleToSimpleDictionaryCount = 0;
  this->convertPathToDictionaryExceededLengthCount = 0;
  this->convertPathToDictionaryDeletedCount = 0;
  this->convertPathToDictionaryAttributesCount = 0;
  this->convertPathToDictionaryItemAttributesCount = 0;
  this->convertPathToDictionaryAccessorsCount = 0;
  this->convertPathToDictionaryItemAccessorsCount = 0;
  this->convertPathToDictionaryExtensionsCount = 0;
  this->convertPathToDictionaryProtoCount = 0;
  this->convertPathToDictionaryNoRootCount = 0;
  this->convertPathToDictionaryResetCount = 0;
  this->convertPathToSimpleDictionaryCount = 0;
  this->convertSimplePathToPathCount = 0;
  this->convertSimpleDictionaryToDictionaryCount = 0;
  this->convertSimpleSharedDictionaryToNonSharedCount = 0;
  this->convertSimpleSharedToNonSharedCount = 0;
  this->pathTypeHandlerCount = 0;
  this->promoteCount = 0;
  this->cacheCount = 0;
  this->branchCount = 0;
  this->maxPathLength = 0;
  memset(this->typeCount,0,0x160);
  memset(this->instanceCount,0,0x160);
  this->objectLiteralInstanceCount = 0;
  this->objectLiteralPathCount = 0;
  memset(this->objectLiteralCount,0,0x200);
  this->objectLiteralSimpleDictionaryCount = 0;
  this->objectLiteralMaxLength = 0;
  this->objectLiteralPromoteCount = 0;
  this->objectLiteralCacheCount = 0;
  this->objectLiteralBranchCount = 0;
  this->byteCodeDataSize = 0;
  this->byteCodeAuxiliaryDataSize = 0;
  this->byteCodeAuxiliaryContextDataSize = 0;
  memset(this->byteCodeHistogram,0,0x624);
  uVar1 = ThreadContext::GetScriptContextCount(threadContext);
  this->allocId = uVar1;
  this->hadProfiled = false;
  this->forinCache = 0;
  this->forinNoCache = 0;
  this->callCount = 0;
  this_00 = ThreadContext::GetHiResTimer(threadContext);
  PlatformAgnostic::DateTime::HiResTimer::Reset(this_00);
  this->profiler = (ScriptContextProfiler *)0x0;
  this->isProfilerCreated = false;
  this->disableProfiler = false;
  this->ensureParentInfo = false;
  this->profileMemoryDump = true;
  pRVar3 = GetRecycler(this);
  Memory::RecyclerFastAllocator<Js::JavascriptNumber,_(Memory::ObjectInfoBits)32>::Initialize
            (&this->numberAllocator,pRVar3);
  this->m_iProfileSession = -1;
  this->urlRecord = (UrlRecord *)0x0;
  this->isRootTrackerScriptContext = false;
  local_2c.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_2c);
  return;
}

Assistant:

ScriptContext::ScriptContext(ThreadContext* threadContext) :
        ScriptContextBase(),
        prev(nullptr),
        next(nullptr),
        interpreterArena(nullptr),
        moduleSrcInfoCount(0),
        // Regex globals
#if ENABLE_REGEX_CONFIG_OPTIONS
        regexStatsDatabase(0),
        regexDebugWriter(0),
#endif
        trigramAlphabet(nullptr),
        regexStacks(nullptr),
        config(threadContext->GetConfig(), threadContext->IsOptimizedForManyInstances()),
#if ENABLE_BACKGROUND_PARSING
        backgroundParser(nullptr),
#endif
#if ENABLE_NATIVE_CODEGEN
        nativeCodeGen(nullptr),
        m_remoteScriptContextAddr(nullptr),
        jitFuncRangeCache(nullptr),
#endif
        threadContext(threadContext),
        scriptStartEventHandler(nullptr),
        scriptEndEventHandler(nullptr),
#ifdef FAULT_INJECTION
        disposeScriptByFaultInjectionEventHandler(nullptr),
#endif

#ifndef CC_LOW_MEMORY_TARGET
        integerStringMapCacheMissCount(0),
        integerStringMapCacheUseCount(0),
#endif
#ifdef ENABLE_SCRIPT_DEBUGGING
        diagnosticArena(nullptr),
        raiseMessageToDebuggerFunctionType(nullptr),
        transitionToDebugModeIfFirstSourceFn(nullptr),
        debugContext(nullptr),
        isDebugContextInitialized(false),
        isEnumeratingRecyclerObjects(false),
#endif
        sourceSize(0),
        deferredBody(false),
        isScriptContextActuallyClosed(false),
        isFinalized(false),
        isEvalRestricted(false),
        isInvalidatedForHostObjects(false),
        fastDOMenabled(false),
        directHostTypeId(TypeIds_GlobalObject),
        isPerformingNonreentrantWork(false),
        isDiagnosticsScriptContext(false),
        m_enumerateNonUserFunctionsOnly(false),
        scriptContextPrivilegeLevel(ScriptContextPrivilegeLevel::Low),
        recycler(threadContext->EnsureRecycler()),
        CurrentThunk(DefaultEntryThunk),
        CurrentCrossSiteThunk(CrossSite::DefaultThunk),
        DeferredParsingThunk(DefaultDeferredParsingThunk),
        DeferredDeserializationThunk(DefaultDeferredDeserializeThunk),
        DispatchDefaultInvoke(nullptr),
        DispatchProfileInvoke(nullptr),
        m_pBuiltinFunctionIdMap(nullptr),
        hostScriptContext(nullptr),
        scriptEngineHaltCallback(nullptr),
#if DYNAMIC_INTERPRETER_THUNK
        interpreterThunkEmitter(nullptr),
#endif
#ifdef ASMJS_PLAT
        asmJsInterpreterThunkEmitter(nullptr),
        asmJsCodeGenerator(nullptr),
#endif
        generalAllocator(_u("SC-General"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#ifdef ENABLE_BASIC_TELEMETRY
        telemetryAllocator(_u("SC-Telemetry"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#endif
        dynamicProfileInfoAllocator(_u("SC-DynProfileInfo"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#ifdef SEPARATE_ARENA
        sourceCodeAllocator(_u("SC-Code"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
        regexAllocator(_u("SC-Regex"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#endif
#ifdef NEED_MISC_ALLOCATOR
        miscAllocator(_u("GC-Misc"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
#endif
        inlineCacheAllocator(_u("SC-InlineCache"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
        isInstInlineCacheAllocator(_u("SC-IsInstInlineCache"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
        enumeratorCacheAllocator(_u("SC-EnumeratorCache"), threadContext->GetPageAllocator(), Throw::OutOfMemory),
        hasUsedInlineCache(false),
        hasProtoOrStoreFieldInlineCache(false),
        hasIsInstInlineCache(false),
        noSpecialPropertyRegistry(this, threadContext->GetNoSpecialPropertyRegistry()),
        onlyWritablePropertyRegistry(this, threadContext->GetOnlyWritablePropertyRegistry()),
        firstInterpreterFrameReturnAddress(nullptr),
        builtInLibraryFunctions(nullptr),
        isWeakReferenceDictionaryListCleared(false)
#if ENABLE_PROFILE_INFO
        , referencesSharedDynamicSourceContextInfo(false)
#endif
#if DBG
        , isInitialized(false)
        , isCloningGlobal(false)
        , bindRef(MiscAllocator())
#endif
#if ENABLE_TTD
        , TTDHostCallbackFunctor()
        , ScriptContextLogTag(TTD_INVALID_LOG_PTR_ID)
        , TTDWellKnownInfo(nullptr)
        , TTDContextInfo(nullptr)
        , TTDSnapshotOrInflateInProgress(false)
        , TTDRecordOrReplayModeEnabled(false)
        , TTDRecordModeEnabled(false)
        , TTDReplayModeEnabled(false)
        , TTDShouldPerformRecordOrReplayAction(false)
        , TTDShouldPerformRecordAction(false)
        , TTDShouldPerformReplayAction(false)
        , TTDShouldPerformRecordOrReplayDebuggerAction(false)
        , TTDShouldPerformRecordDebuggerAction(false)
        , TTDShouldPerformReplayDebuggerAction(false)
        , TTDShouldSuppressGetterInvocationForDebuggerEvaluation(false)
#endif
#ifdef REJIT_STATS
        , rejitStatsMap(nullptr)
        , bailoutReasonCounts(nullptr)
        , bailoutReasonCountsCap(nullptr)
        , rejitReasonCounts(nullptr)
        , rejitReasonCountsCap(nullptr)
#endif
#ifdef ENABLE_BASIC_TELEMETRY
        , telemetry()
#endif
#ifdef INLINE_CACHE_STATS
        , cacheDataMap(nullptr)
#endif
#ifdef FIELD_ACCESS_STATS
        , fieldAccessStatsByFunctionNumber(nullptr)
#endif
        , webWorkerId(Js::Constants::NonWebWorkerContextId)
        , url(_u(""))
        , startupComplete(false)
#ifdef EDIT_AND_CONTINUE
        , activeScriptEditQuery(nullptr)
#endif
#ifdef RECYCLER_PERF_COUNTERS
        , bindReferenceCount(0)
#endif
        , nextPendingClose(nullptr)
#ifdef ENABLE_SCRIPT_PROFILING
        , heapEnum(nullptr)
        , m_fTraceDomCall(FALSE)
#endif
        , intConstPropsOnGlobalObject(nullptr)
        , intConstPropsOnGlobalUserObject(nullptr)
#ifdef PROFILE_STRINGS
        , stringProfiler(nullptr)
#endif
#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        , codeSize(0)
        , bailOutRecordBytes(0)
        , bailOutOffsetBytes(0)
#endif
        , emptyStringPropertyId(Js::PropertyIds::_none)
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
       // This may allocate memory and cause exception, but it is ok, as we all we have done so far
       // are field init and those dtor will be called if exception occurs
       threadContext->EnsureDebugManager();
#endif
       // Don't use throwing memory allocation in ctor, as exception in ctor doesn't cause the dtor to be called
       // potentially causing memory leaks
       BEGIN_NO_EXCEPTION;

#ifdef RUNTIME_DATA_COLLECTION
        createTime = time(nullptr);
#endif

#ifdef BGJIT_STATS
        interpretedCount = maxFuncInterpret = funcJITCount = bytecodeJITCount = interpretedCallsHighPri = jitCodeUsed = funcJitCodeUsed = loopJITCount = speculativeJitCount = 0;
#endif

#ifdef PROFILE_TYPES
        convertNullToSimpleCount = 0;
        convertNullToSimpleDictionaryCount = 0;
        convertNullToDictionaryCount = 0;
        convertDeferredToDictionaryCount = 0;
        convertDeferredToSimpleDictionaryCount = 0;
        convertSimpleToDictionaryCount = 0;
        convertSimpleToSimpleDictionaryCount = 0;
        convertPathToDictionaryExceededLengthCount = 0;
        convertPathToDictionaryDeletedCount = 0;
        convertPathToDictionaryAttributesCount = 0;
        convertPathToDictionaryItemAttributesCount = 0;
        convertPathToDictionaryAccessorsCount = 0;
        convertPathToDictionaryItemAccessorsCount = 0;
        convertPathToDictionaryExtensionsCount = 0;
        convertPathToDictionaryProtoCount = 0;
        convertPathToDictionaryNoRootCount = 0;
        convertPathToDictionaryResetCount = 0;
        convertPathToSimpleDictionaryCount = 0;
        convertSimplePathToPathCount = 0;
        convertSimpleDictionaryToDictionaryCount = 0;
        convertSimpleSharedDictionaryToNonSharedCount = 0;
        convertSimpleSharedToNonSharedCount = 0;
        pathTypeHandlerCount = 0;
        promoteCount = 0;
        cacheCount = 0;
        branchCount = 0;
        maxPathLength = 0;
        memset(typeCount, 0, sizeof(typeCount));
        memset(instanceCount, 0, sizeof(instanceCount));
#endif

#ifdef PROFILE_OBJECT_LITERALS
        objectLiteralInstanceCount = 0;
        objectLiteralPathCount = 0;
        memset(objectLiteralCount, 0, sizeof(objectLiteralCount));
        objectLiteralSimpleDictionaryCount = 0;
        objectLiteralMaxLength = 0;
        objectLiteralPromoteCount = 0;
        objectLiteralCacheCount = 0;
        objectLiteralBranchCount = 0;
#endif
#if DBG_DUMP
        byteCodeDataSize = 0;
        byteCodeAuxiliaryDataSize = 0;
        byteCodeAuxiliaryContextDataSize = 0;
        memset(byteCodeHistogram, 0, sizeof(byteCodeHistogram));
#endif

#if DBG || defined(RUNTIME_DATA_COLLECTION)
        this->allocId = threadContext->GetScriptContextCount();
#endif
#if DBG
        this->hadProfiled = false;
#endif
#if DBG_DUMP
        forinCache = 0;
        forinNoCache = 0;
#endif

        callCount = 0;

        threadContext->GetHiResTimer()->Reset();

#ifdef PROFILE_EXEC
        profiler = nullptr;
        isProfilerCreated = false;
        disableProfiler = false;
        ensureParentInfo = false;
#endif

#ifdef PROFILE_MEM
        profileMemoryDump = true;
#endif

#ifdef ENABLE_SCRIPT_PROFILING
        m_pProfileCallback = nullptr;
        m_pProfileCallback2 = nullptr;
        m_inProfileCallback = FALSE;
        CleanupDocumentContext = nullptr;
#endif

        // Do this after all operations that may cause potential exceptions. Note: InitialAllocations may still throw!
        numberAllocator.Initialize(this->GetRecycler());

#if DEBUG
        m_iProfileSession = -1;
#endif
#ifdef LEAK_REPORT
        this->urlRecord = nullptr;
        this->isRootTrackerScriptContext = false;
#endif

        PERF_COUNTER_INC(Basic, ScriptContext);
        PERF_COUNTER_INC(Basic, ScriptContextActive);

        END_NO_EXCEPTION;
    }